

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TStokesAnalytic::Duxy<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZFMatrix<Fad<double>_> *Du)

{
  Fad<double> *pFVar1;
  int j;
  long col;
  int i;
  long row;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_180;
  undefined1 local_170 [8];
  undefined8 local_168;
  double *pdStack_160;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFStack_158;
  TPZFMatrix<Fad<double>_> gradT;
  TPZFMatrix<Fad<double>_> grad;
  
  gradT.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  gradT.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow._0_4_ = 0;
  gradT.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = 0;
  gradT.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  gradT.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  gradT.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix._26_6_ = 0;
  TPZFMatrix<Fad<double>_>::TPZFMatrix(&grad,3,3,(Fad<double> *)&gradT);
  Fad<double>::~Fad((Fad<double> *)&gradT);
  local_170 = (undefined1  [8])0x0;
  local_168 = (double)((ulong)local_168._4_4_ << 0x20);
  pdStack_160 = (double *)0x0;
  pFStack_158 = (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)0x0;
  TPZFMatrix<Fad<double>_>::TPZFMatrix(&gradT,3,3,(Fad<double> *)local_170);
  Fad<double>::~Fad((Fad<double> *)local_170);
  graduxy<Fad<double>>(this,x,&grad);
  TPZFMatrix<Fad<double>_>::Transpose(&grad,&gradT.super_TPZMatrix<Fad<double>_>);
  for (row = 0; row != 3; row = row + 1) {
    for (col = 0; col != 3; col = col + 1) {
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&grad,row,col);
      local_180.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(&gradT,row,col);
      local_168 = 0.5;
      pdStack_160 = (double *)0x0;
      local_180.fadexpr_.left_ = pFVar1;
      pFStack_158 = &local_180;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(Du,row,col);
      Fad<double>::operator=
                (pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                         *)local_170);
    }
  }
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&gradT);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&grad);
  return;
}

Assistant:

void TStokesAnalytic::Duxy(const TPZVec<TVar> &x, TPZFMatrix<TVar> &Du) const
{
    TPZFMatrix<TVar> grad(3,3,0.), gradT(3,3,0.);
    graduxy(x,grad);
    grad.Transpose(&gradT);
    for(int i=0; i<3; i++)
    {
        for(int j=0; j<3; j++)
        {
            Du(i,j) = 0.5*(grad(i,j)+gradT(i,j));
        }
    }
}